

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_sqrt(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  char *new_ext;
  
  iVar1 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar1 == 0) {
    compute_sqrt_into(new_ext,(this->super_CVmObject).ext_);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_sqrt(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *argc)
{
    char *new_ext;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* compute the square root into the result */
    compute_sqrt_into(new_ext, ext_);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}